

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::createConnection
          (PortConnectionBuilder *this,InterfacePortSymbol *port,IfaceConn ifaceConn,
          Expression *expr,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  PortConnection *conn;
  Expression *local_28;
  pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> local_20;
  
  local_20.second = ifaceConn.second;
  local_20.first = ifaceConn.first;
  local_28 = expr;
  conn = BumpAllocator::
         emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>&,slang::ast::Expression_const*&>
                   (&this->comp->super_BumpAllocator,port,&local_20,&local_28);
  if (attributes._M_extent._M_extent_value != 0) {
    Compilation::setAttributes(this->comp,conn,attributes);
  }
  return conn;
}

Assistant:

PortConnection* createConnection(const InterfacePortSymbol& port,
                                     PortConnection::IfaceConn ifaceConn, const Expression* expr,
                                     std::span<const AttributeSymbol* const> attributes) {
        auto conn = comp.emplace<PortConnection>(port, ifaceConn, expr);
        if (!attributes.empty())
            comp.setAttributes(*conn, attributes);

        return conn;
    }